

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

string * __thiscall
t_php_generator::type_to_phpdoc_abi_cxx11_
          (string *__return_storage_ptr__,t_php_generator *this,t_type *type)

{
  uint uVar1;
  int iVar2;
  t_program *p;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  undefined4 extraout_var_00;
  string local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  t_type *local_e8;
  t_type *t_elem_1;
  t_list *tlist;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  t_type *local_78;
  t_type *t_elem;
  t_set *tset;
  string local_60;
  allocator local_3c;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  allocator local_38;
  allocator local_37;
  allocator local_36;
  allocator local_35 [16];
  allocator local_25;
  t_base local_24;
  t_set *ptStack_20;
  t_base tbase;
  t_type *type_local;
  t_php_generator *this_local;
  
  ptStack_20 = (t_set *)type;
  type_local = (t_type *)this;
  this_local = (t_php_generator *)__return_storage_ptr__;
  ptStack_20 = (t_set *)t_generator::get_true_type(type);
  uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[5])();
  if ((uVar1 & 1) == 0) {
    uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[10])();
    if ((uVar1 & 1) == 0) {
      uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xb])();
      if (((uVar1 & 1) == 0) &&
         (uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xc])(),
         (uVar1 & 1) == 0)) {
        uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0x10])();
        if ((uVar1 & 1) == 0) {
          uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xf])();
          if ((uVar1 & 1) == 0) {
            uVar1 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[0xe])();
            if ((uVar1 & 1) == 0) goto switchD_00416bf8_default;
            t_elem_1 = (t_type *)ptStack_20;
            local_e8 = t_list::get_elem_type((t_list *)ptStack_20);
            uVar1 = (*(local_e8->super_t_doc)._vptr_t_doc[0xd])();
            if ((uVar1 & 1) == 0) {
              type_to_phpdoc_abi_cxx11_(&local_148,this,local_e8);
              std::operator+(__return_storage_ptr__,&local_148,"[]");
              std::__cxx11::string::~string((string *)&local_148);
            }
            else {
              type_to_phpdoc_abi_cxx11_(&local_128,this,local_e8);
              std::operator+(&local_108,"(",&local_128);
              std::operator+(__return_storage_ptr__,&local_108,")[]");
              std::__cxx11::string::~string((string *)&local_108);
              std::__cxx11::string::~string((string *)&local_128);
            }
          }
          else {
            t_elem = (t_type *)ptStack_20;
            local_78 = t_set::get_elem_type(ptStack_20);
            uVar1 = (*(local_78->super_t_doc)._vptr_t_doc[0xd])();
            if ((uVar1 & 1) == 0) {
              type_to_phpdoc_abi_cxx11_((string *)&tlist,this,local_78);
              std::operator+(__return_storage_ptr__,(string *)&tlist,"[]");
              std::__cxx11::string::~string((string *)&tlist);
            }
            else {
              type_to_phpdoc_abi_cxx11_(&local_b8,this,local_78);
              std::operator+(&local_98,"(",&local_b8);
              std::operator+(__return_storage_ptr__,&local_98,")[]");
              std::__cxx11::string::~string((string *)&local_98);
              std::__cxx11::string::~string((string *)&local_b8);
            }
          }
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)__return_storage_ptr__,"array",(allocator *)((long)&tset + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&tset + 7));
        }
      }
      else {
        p = t_type::get_program((t_type *)ptStack_20);
        php_namespace_abi_cxx11_(&local_60,this,p);
        iVar2 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[3])();
        std::operator+(__return_storage_ptr__,&local_60,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(extraout_var,iVar2));
        std::__cxx11::string::~string((string *)&local_60);
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"int",&local_3c);
      std::allocator<char>::~allocator((allocator<char> *)&local_3c);
    }
  }
  else {
    local_24 = t_base_type::get_base((t_base_type *)ptStack_20);
    switch(local_24) {
    case TYPE_VOID:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"void",&local_25);
      std::allocator<char>::~allocator((allocator<char> *)&local_25);
      break;
    case TYPE_STRING:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"string",local_35);
      std::allocator<char>::~allocator((allocator<char> *)local_35);
      break;
    case TYPE_BOOL:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"bool",&local_36);
      std::allocator<char>::~allocator((allocator<char> *)&local_36);
      break;
    case TYPE_I8:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"int",&local_37);
      std::allocator<char>::~allocator((allocator<char> *)&local_37);
      break;
    case TYPE_I16:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"int",&local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_38);
      break;
    case TYPE_I32:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"int",&local_39);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      break;
    case TYPE_I64:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"int",&local_3a);
      std::allocator<char>::~allocator((allocator<char> *)&local_3a);
      break;
    case TYPE_DOUBLE:
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"double",&local_3b);
      std::allocator<char>::~allocator((allocator<char> *)&local_3b);
      break;
    default:
switchD_00416bf8_default:
      __return_storage_ptr___00 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      iVar2 = (*(ptStack_20->super_t_container).super_t_type.super_t_doc._vptr_t_doc[3])();
      std::operator+(__return_storage_ptr___00,"INVALID TYPE IN type_to_enum: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(extraout_var_00,iVar2));
      __cxa_throw(__return_storage_ptr___00,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string t_php_generator::type_to_phpdoc(t_type* type) {
  type = get_true_type(type);

  if (type->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_VOID:
      return "void";
    case t_base_type::TYPE_STRING:
      return "string";
    case t_base_type::TYPE_BOOL:
      return "bool";
    case t_base_type::TYPE_I8:
      return "int";
    case t_base_type::TYPE_I16:
      return "int";
    case t_base_type::TYPE_I32:
      return "int";
    case t_base_type::TYPE_I64:
      return "int";
    case t_base_type::TYPE_DOUBLE:
      return "double";
    }
  } else if (type->is_enum()) {
    return "int";
  } else if (type->is_struct() || type->is_xception()) {
    return php_namespace(type->get_program()) + type->get_name();
  } else if (type->is_map()) {
    return "array";
  } else if (type->is_set()) {
    t_set* tset = static_cast<t_set*>(type);
    t_type* t_elem = tset->get_elem_type();
    if (t_elem->is_container()) {
      return "(" + type_to_phpdoc(t_elem) + ")[]";
    } else {
      return type_to_phpdoc(t_elem) + "[]";
    }
  } else if (type->is_list()) {
    t_list* tlist = static_cast<t_list*>(type);
    t_type* t_elem = tlist->get_elem_type();
    if (t_elem->is_container()) {
      return "(" + type_to_phpdoc(t_elem) + ")[]";
    } else {
      return type_to_phpdoc(t_elem) + "[]";
    }
  }

  throw "INVALID TYPE IN type_to_enum: " + type->get_name();
}